

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ReLU_x86_avx512::forward_inplace(ReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [64];
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar15 [64];
  
  iVar11 = bottom_top_blob->elempack;
  if ((iVar11 == 0) || (iVar9 = (int)bottom_top_blob->elemsize << 3, iVar9 / iVar11 != 8)) {
    iVar11 = iVar11 * bottom_top_blob->w * bottom_top_blob->h * bottom_top_blob->d;
    uVar10 = 0;
    if (0 < bottom_top_blob->c) {
      uVar10 = (ulong)(uint)bottom_top_blob->c;
    }
    if ((this->super_ReLU).slope == 0.0) {
      for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        pauVar13 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        for (iVar9 = 0; iVar9 + 0xf < iVar11; iVar9 = iVar9 + 0x10) {
          auVar14 = vmaxps_avx512f(ZEXT864(0),*pauVar13);
          *pauVar13 = auVar14;
          pauVar13 = pauVar13 + 1;
        }
        for (; iVar9 + 7 < iVar11; iVar9 = iVar9 + 8) {
          auVar18 = vmaxps_avx(ZEXT832(0),*(undefined1 (*) [32])*pauVar13);
          *(undefined1 (*) [32])*pauVar13 = auVar18;
          pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
        }
        for (; iVar9 + 3 < iVar11; iVar9 = iVar9 + 4) {
          auVar17 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*pauVar13);
          *(undefined1 (*) [16])*pauVar13 = auVar17;
          pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
        }
        for (; iVar9 < iVar11; iVar9 = iVar9 + 1) {
          auVar17 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)*pauVar13));
          *(int *)*pauVar13 = auVar17._0_4_;
          pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
        }
      }
    }
    else {
      for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
        pauVar13 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar14 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_ReLU).slope));
        for (iVar9 = 0; iVar9 + 0xf < iVar11; iVar9 = iVar9 + 0x10) {
          auVar2 = *pauVar13;
          uVar8 = vcmpps_avx512f(auVar2,ZEXT864(0),1);
          auVar15 = vmulps_avx512f(auVar2,auVar14);
          bVar3 = (bool)((byte)uVar8 & 1);
          auVar16._0_4_ = (uint)bVar3 * auVar15._0_4_ | (uint)!bVar3 * auVar2._0_4_;
          bVar3 = (bool)((byte)(uVar8 >> 1) & 1);
          auVar16._4_4_ = (uint)bVar3 * auVar15._4_4_ | (uint)!bVar3 * auVar2._4_4_;
          bVar3 = (bool)((byte)(uVar8 >> 2) & 1);
          auVar16._8_4_ = (uint)bVar3 * auVar15._8_4_ | (uint)!bVar3 * auVar2._8_4_;
          bVar3 = (bool)((byte)(uVar8 >> 3) & 1);
          auVar16._12_4_ = (uint)bVar3 * auVar15._12_4_ | (uint)!bVar3 * auVar2._12_4_;
          bVar3 = (bool)((byte)(uVar8 >> 4) & 1);
          auVar16._16_4_ = (uint)bVar3 * auVar15._16_4_ | (uint)!bVar3 * auVar2._16_4_;
          bVar3 = (bool)((byte)(uVar8 >> 5) & 1);
          auVar16._20_4_ = (uint)bVar3 * auVar15._20_4_ | (uint)!bVar3 * auVar2._20_4_;
          bVar3 = (bool)((byte)(uVar8 >> 6) & 1);
          auVar16._24_4_ = (uint)bVar3 * auVar15._24_4_ | (uint)!bVar3 * auVar2._24_4_;
          bVar3 = (bool)((byte)(uVar8 >> 7) & 1);
          auVar16._28_4_ = (uint)bVar3 * auVar15._28_4_ | (uint)!bVar3 * auVar2._28_4_;
          bVar3 = (bool)((byte)(uVar8 >> 8) & 1);
          auVar16._32_4_ = (uint)bVar3 * auVar15._32_4_ | (uint)!bVar3 * auVar2._32_4_;
          bVar3 = (bool)((byte)(uVar8 >> 9) & 1);
          auVar16._36_4_ = (uint)bVar3 * auVar15._36_4_ | (uint)!bVar3 * auVar2._36_4_;
          bVar3 = (bool)((byte)(uVar8 >> 10) & 1);
          auVar16._40_4_ = (uint)bVar3 * auVar15._40_4_ | (uint)!bVar3 * auVar2._40_4_;
          bVar3 = (bool)((byte)(uVar8 >> 0xb) & 1);
          auVar16._44_4_ = (uint)bVar3 * auVar15._44_4_ | (uint)!bVar3 * auVar2._44_4_;
          bVar3 = (bool)((byte)(uVar8 >> 0xc) & 1);
          auVar16._48_4_ = (uint)bVar3 * auVar15._48_4_ | (uint)!bVar3 * auVar2._48_4_;
          bVar3 = (bool)((byte)(uVar8 >> 0xd) & 1);
          auVar16._52_4_ = (uint)bVar3 * auVar15._52_4_ | (uint)!bVar3 * auVar2._52_4_;
          bVar3 = (bool)((byte)(uVar8 >> 0xe) & 1);
          auVar16._56_4_ = (uint)bVar3 * auVar15._56_4_ | (uint)!bVar3 * auVar2._56_4_;
          bVar3 = SUB81(uVar8 >> 0xf,0);
          auVar16._60_4_ = (uint)bVar3 * auVar15._60_4_ | (uint)!bVar3 * auVar2._60_4_;
          *pauVar13 = auVar16;
          pauVar13 = pauVar13 + 1;
        }
        fVar1 = (this->super_ReLU).slope;
        auVar18._4_4_ = fVar1;
        auVar18._0_4_ = fVar1;
        auVar18._8_4_ = fVar1;
        auVar18._12_4_ = fVar1;
        auVar18._16_4_ = fVar1;
        auVar18._20_4_ = fVar1;
        auVar18._24_4_ = fVar1;
        auVar18._28_4_ = fVar1;
        for (; iVar9 + 7 < iVar11; iVar9 = iVar9 + 8) {
          auVar5 = vmaxps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
          auVar7 = vminps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
          auVar17 = vfmadd213ps_fma(auVar7,auVar18,auVar5);
          *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar17);
          pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
        }
        fVar1 = (this->super_ReLU).slope;
        auVar17._4_4_ = fVar1;
        auVar17._0_4_ = fVar1;
        auVar17._8_4_ = fVar1;
        auVar17._12_4_ = fVar1;
        for (; iVar9 + 3 < iVar11; iVar9 = iVar9 + 4) {
          auVar4 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
          auVar6 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
          auVar4 = vfmadd213ps_fma(auVar6,auVar17,auVar4);
          *(undefined1 (*) [16])*pauVar13 = auVar4;
          pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
        }
        for (; iVar9 < iVar11; iVar9 = iVar9 + 1) {
          if (*(float *)*pauVar13 < 0.0) {
            *(float *)*pauVar13 = *(float *)*pauVar13 * (this->super_ReLU).slope;
          }
          pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
        }
      }
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar9 % (long)iVar11 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}